

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantUtil.hpp
# Opt level: O0

vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
* vkt::pipeline::makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
            (vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
             *__return_storage_ptr__,OffsetValue *o1,OffsetValue *o2,OffsetValue *o3,OffsetValue *o4
            )

{
  OffsetValue *o4_local;
  OffsetValue *o3_local;
  OffsetValue *o2_local;
  OffsetValue *o1_local;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *vec;
  
  std::
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  ::reserve(__return_storage_ptr__,4);
  std::
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  ::push_back(__return_storage_ptr__,o1);
  std::
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  ::push_back(__return_storage_ptr__,o2);
  std::
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  ::push_back(__return_storage_ptr__,o3);
  std::
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  ::push_back(__return_storage_ptr__,o4);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> makeVector (const T& o1, const T& o2, const T& o3, const T& o4)
{
	std::vector<T> vec;
	vec.reserve(4);
	vec.push_back(o1);
	vec.push_back(o2);
	vec.push_back(o3);
	vec.push_back(o4);
	return vec;
}